

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O3

void __thiscall
cmOrderDirectoriesConstraintSOName::cmOrderDirectoriesConstraintSOName
          (cmOrderDirectoriesConstraintSOName *this,cmOrderDirectories *od,string *file,char *soname
          )

{
  bool bVar1;
  size_t sVar2;
  char *__s;
  string soguess;
  string local_48;
  
  cmOrderDirectoriesConstraint::cmOrderDirectoriesConstraint
            (&this->super_cmOrderDirectoriesConstraint,od,file);
  (this->super_cmOrderDirectoriesConstraint)._vptr_cmOrderDirectoriesConstraint =
       (_func_int **)&PTR__cmOrderDirectoriesConstraintSOName_00b247e8;
  __s = "";
  if (soname != (char *)0x0) {
    __s = soname;
  }
  (this->SOName)._M_dataplus._M_p = (pointer)&(this->SOName).field_2;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->SOName,__s,__s + sVar2);
  if ((this->SOName)._M_string_length == 0) {
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    bVar1 = cmSystemTools::GuessLibrarySOName(file,&local_48);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&this->SOName);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                               local_48.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

cmOrderDirectoriesConstraintSOName(cmOrderDirectories* od,
                                     std::string const& file,
                                     const char* soname)
    : cmOrderDirectoriesConstraint(od, file)
    , SOName(soname ? soname : "")
  {
    if (this->SOName.empty()) {
      // Try to guess the soname.
      std::string soguess;
      if (cmSystemTools::GuessLibrarySOName(file, soguess)) {
        this->SOName = soguess;
      }
    }
  }